

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TThreadsFactory.cpp
# Opt level: O0

void * ThreadHelper(void *context)

{
  void *__retval;
  undefined8 *in_RDI;
  TThreadContext *threadContext;
  void *ret;
  uint in_stack_ffffffffffffffdc;
  TThreadsFactory *in_stack_ffffffffffffffe0;
  
  __retval = (void *)(*(code *)*in_RDI)(in_RDI[1]);
  TThreadsFactory::GetInstance(SUB81((ulong)__retval >> 0x38,0));
  TThreadsFactory::ResetThread(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  if (in_RDI != (undefined8 *)0x0) {
    operator_delete(in_RDI,0x20);
  }
  pthread_exit(__retval);
}

Assistant:

void * ThreadHelper(void * context)
{
    void * ret;
    TThreadContext * threadContext = reinterpret_cast<TThreadContext *>(context);

    ret = threadContext->fFunction(threadContext->fArgument);

    /* We're done with user thread
     * It's time to finish ourselves and to release resources
     */
    TThreadsFactory::GetInstance()->ResetThread(threadContext->fId);
    delete threadContext;

    pthread_exit(ret);
    return ret;
}